

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O2

char * linear_strdup(void *parent,char *str)

{
  size_t sVar1;
  char *__dest;
  
  if (str != (char *)0x0) {
    sVar1 = strlen(str);
    __dest = (char *)linear_alloc_child(parent,(int)sVar1 + 1);
    if (__dest != (char *)0x0) {
      memcpy(__dest,str,sVar1 & 0xffffffff);
      __dest[sVar1 & 0xffffffff] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
linear_strdup(void *parent, const char *str)
{
   unsigned n;
   char *ptr;

   if (unlikely(!str))
      return NULL;

   n = strlen(str);
   ptr = linear_alloc_child(parent, n + 1);
   if (unlikely(!ptr))
      return NULL;

   memcpy(ptr, str, n);
   ptr[n] = '\0';
   return ptr;
}